

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O0

void __thiscall
SBarInfoCommandFlowControl::Tick
          (SBarInfoCommandFlowControl *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,
          bool hudChanged)

{
  bool bVar1;
  SBarInfoCommand **ppSVar2;
  SBarInfoCommand *command;
  iterator __end1;
  iterator __begin1;
  TDeletingArray<SBarInfoCommand_*,_SBarInfoCommand_*> *__range1;
  bool hudChanged_local;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  SBarInfoCommandFlowControl *this_local;
  
  bVar1 = this->truth;
  __end1 = TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::begin
                     (&this->commands[bVar1 & 1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>)
  ;
  command = (SBarInfoCommand *)
            TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::end
                      (&this->commands[bVar1 & 1].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>
                      );
  while( true ) {
    bVar1 = TIterator<SBarInfoCommand_*>::operator!=
                      (&__end1,(TIterator<SBarInfoCommand_*> *)&command);
    if (!bVar1) break;
    ppSVar2 = TIterator<SBarInfoCommand_*>::operator*(&__end1);
    (*(*ppSVar2)->_vptr_SBarInfoCommand[5])(*ppSVar2,block,statusBar,(ulong)hudChanged);
    TIterator<SBarInfoCommand_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			for(auto command : commands[truth])
				command->Tick(block, statusBar, hudChanged);
		}